

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

string * optionEntryTypeToString_abi_cxx11_(string *__return_storage_ptr__,HighsOptionType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (type == kDouble) {
    pcVar2 = "double";
    paVar1 = &local_b;
  }
  else if (type == kInt) {
    pcVar2 = "HighsInt";
    paVar1 = &local_a;
  }
  else if (type == kBool) {
    pcVar2 = "bool";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "string";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string optionEntryTypeToString(const HighsOptionType type) {
  if (type == HighsOptionType::kBool) {
    return "bool";
  } else if (type == HighsOptionType::kInt) {
    return "HighsInt";
  } else if (type == HighsOptionType::kDouble) {
    return "double";
  } else {
    return "string";
  }
}